

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O2

void Memory::HeapBucketT<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>::
     VerifyBlockConsistencyInList
               (SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *heapBlock,
               RecyclerVerifyListConsistencyData *recyclerSweep)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  undefined4 *puVar4;
  SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *pSVar5;
  char *message;
  char *error;
  uint lineNumber;
  
  pSVar5 = (SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *)
           (recyclerSweep->mediumBlockVerifyListConsistencyData).nextAllocableBlockHead;
  if (pSVar5 == heapBlock) {
    (recyclerSweep->mediumBlockVerifyListConsistencyData).expectFull = false;
  }
  bVar2 = SmallHeapBlockT<MediumAllocationBlockAttributes>::IsClearedFromAllocator
                    ((SmallHeapBlockT<MediumAllocationBlockAttributes> *)heapBlock);
  if (bVar2) {
    if (((recyclerSweep->mediumBlockVerifyListConsistencyData).expectFull != true) ||
       ((recyclerSweep->mediumBlockVerifyListConsistencyData).expectDispose == true)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                         ,0x3bb,"(*expectFull && !*expectDispose)","*expectFull && !*expectDispose")
      ;
      if (!bVar2) goto LAB_0063f154;
      *puVar4 = 0;
    }
    if ((heapBlock->super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>).
        super_SmallHeapBlockT<MediumAllocationBlockAttributes>.freeObjectList == (FreeObject *)0x0)
    {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                         ,0x3bc,"(heapBlock->HasFreeObject())","heapBlock->HasFreeObject()");
      if (!bVar2) goto LAB_0063f154;
      *puVar4 = 0;
    }
    if ((heapBlock->pendingDisposeCount == 0) &&
       (heapBlock->disposedObjectList == (FreeObject *)0x0)) {
      return;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    error = "(!heapBlock->HasAnyDisposeObjects())";
    message = "!heapBlock->HasAnyDisposeObjects()";
    lineNumber = 0x3bd;
  }
  else if ((recyclerSweep->mediumBlockVerifyListConsistencyData).expectDispose == true) {
    bVar2 = HeapBlock::IsAnyFinalizableBlock((HeapBlock *)heapBlock);
    if ((!bVar2) ||
       (pSVar5 = HeapBlock::AsFinalizableBlock<MediumAllocationBlockAttributes>
                           ((HeapBlock *)heapBlock), pSVar5->isPendingDispose == false)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                         ,0x3c2,
                         "(heapBlock->IsAnyFinalizableBlock() && heapBlock->template AsFinalizableBlock<typename TBlockType::HeapBlockAttributes>()->IsPendingDispose())"
                         ,
                         "heapBlock->IsAnyFinalizableBlock() && heapBlock->template AsFinalizableBlock<typename TBlockType::HeapBlockAttributes>()->IsPendingDispose()"
                        );
      if (!bVar2) goto LAB_0063f154;
      *puVar4 = 0;
    }
    if (heapBlock->pendingDisposeCount != 0) {
      return;
    }
    if (heapBlock->disposedObjectList != (FreeObject *)0x0) {
      return;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    error = "(heapBlock->HasAnyDisposeObjects())";
    message = "heapBlock->HasAnyDisposeObjects()";
    lineNumber = 0x3c3;
  }
  else {
    if ((heapBlock->pendingDisposeCount != 0) ||
       (heapBlock->disposedObjectList != (FreeObject *)0x0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                         ,0x3c7,"(!heapBlock->HasAnyDisposeObjects())",
                         "!heapBlock->HasAnyDisposeObjects()");
      if (!bVar2) goto LAB_0063f154;
      *puVar4 = 0;
    }
    bVar2 = (recyclerSweep->mediumBlockVerifyListConsistencyData).expectFull;
    if ((heapBlock->super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>).
        super_SmallHeapBlockT<MediumAllocationBlockAttributes>.freeObjectList == (FreeObject *)0x0)
    {
      bVar3 = true;
    }
    else {
      bVar3 = SmallHeapBlockT<MediumAllocationBlockAttributes>::IsInAllocator
                        ((SmallHeapBlockT<MediumAllocationBlockAttributes> *)heapBlock);
    }
    if (pSVar5 == (SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
      return;
    }
    if (bVar3 == bVar2) {
      return;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    error = 
    "(*expectFull == (!heapBlock->HasFreeObject() || heapBlock->IsInAllocator()) || nextAllocableBlockHead == nullptr)"
    ;
    message = 
    "*expectFull == (!heapBlock->HasFreeObject() || heapBlock->IsInAllocator()) || nextAllocableBlockHead == nullptr"
    ;
    lineNumber = 0x3d3;
  }
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                     ,lineNumber,error,message);
  if (bVar2) {
    *puVar4 = 0;
    return;
  }
LAB_0063f154:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void
HeapBucketT<TBlockType>::VerifyBlockConsistencyInList(TBlockType * heapBlock, RecyclerVerifyListConsistencyData& recyclerSweep)
{
    bool* expectFull = nullptr;
    bool* expectDispose = nullptr;
    HeapBlock* nextAllocableBlockHead = nullptr;

    if (TBlockType::HeapBlockAttributes::IsSmallBlock)
    {
        expectFull = &recyclerSweep.smallBlockVerifyListConsistencyData.expectFull;
        expectDispose = &recyclerSweep.smallBlockVerifyListConsistencyData.expectDispose;
        nextAllocableBlockHead = recyclerSweep.smallBlockVerifyListConsistencyData.nextAllocableBlockHead;
    }
    else if (TBlockType::HeapBlockAttributes::IsMediumBlock)
    {
        expectFull = &recyclerSweep.mediumBlockVerifyListConsistencyData.expectFull;
        expectDispose = &recyclerSweep.mediumBlockVerifyListConsistencyData.expectDispose;
        nextAllocableBlockHead = recyclerSweep.mediumBlockVerifyListConsistencyData.nextAllocableBlockHead;
    }
    else
    {
        Assert(false);
    }

    if (heapBlock == nextAllocableBlockHead)
    {
        (*expectFull) = false;
    }
    if (heapBlock->IsClearedFromAllocator())
    {
#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
        // As the blocks are added to a SLIST and used from there during concurrent sweep, the expectFull assertion doesn't hold anymore.
        // We could do some work to make this work again but there may be perf hit and it may be fragile.
        if (!CONFIG_FLAG_RELEASE(EnableConcurrentSweepAlloc))
#endif
        {
            Assert(*expectFull && !*expectDispose);
            Assert(heapBlock->HasFreeObject());
            Assert(!heapBlock->HasAnyDisposeObjects());
        }
    }
    else if (*expectDispose)
    {
        Assert(heapBlock->IsAnyFinalizableBlock() && heapBlock->template AsFinalizableBlock<typename TBlockType::HeapBlockAttributes>()->IsPendingDispose());
        Assert(heapBlock->HasAnyDisposeObjects());
    }
    else
    {
        Assert(!heapBlock->HasAnyDisposeObjects());

        // ExpectFull is a bit of a misnomer if the list in question is the heap block list. It's there to check
        // of the heap block in question is before the nextAllocableBlockHead or not. This is to ensure that
        // blocks before nextAllocableBlockHead that are not being bump allocated from must be considered "full".
        // However, the exception is if this is the only heap block in this bucket, in which case nextAllocableBlockHead
        // would be null
#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
        // As the blocks are added to the SLIST and used from there during concurrent sweep, the expectFull assertion doesn't hold anymore.
        if (!CONFIG_FLAG_RELEASE(EnableConcurrentSweepAlloc))
#endif
        {
            Assert(*expectFull == (!heapBlock->HasFreeObject() || heapBlock->IsInAllocator()) || nextAllocableBlockHead == nullptr);
        }
    }
}